

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

ALLEGRO_FILE_INTERFACE * al_get_new_file_interface(void)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) goto LAB_00160a65;
  }
  if (*(ALLEGRO_FILE_INTERFACE **)(lVar2 + 0x110) != (ALLEGRO_FILE_INTERFACE *)0x0) {
    return *(ALLEGRO_FILE_INTERFACE **)(lVar2 + 0x110);
  }
LAB_00160a65:
  return &_al_file_interface_stdio;
}

Assistant:

const ALLEGRO_FILE_INTERFACE *al_get_new_file_interface(void)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return &_al_file_interface_stdio;

   /* FIXME: this situation should never arise because tls_ has the stdio
    * interface set as a default, but it arises on OS X if
    * pthread_getspecific() is called before pthreads_thread_init()...
    */
   if (tls->new_file_interface)
      return tls->new_file_interface;
   else
      return &_al_file_interface_stdio;
}